

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QPointer<QTextList>>::emplace<QPointer<QTextList>const&>
          (QMovableArrayOps<QPointer<QTextList>> *this,qsizetype i,QPointer<QTextList> *args)

{
  long *plVar1;
  int *piVar2;
  long lVar3;
  Data *pDVar4;
  QObject *pQVar5;
  long lVar6;
  ulong uVar7;
  
  piVar2 = *(int **)this;
  if ((piVar2 == (int *)0x0) || (1 < *piVar2)) {
LAB_005c5184:
    pDVar4 = (args->wp).d;
    pQVar5 = (args->wp).value;
    if (pDVar4 != (Data *)0x0) {
      LOCK();
      (pDVar4->weakref)._q_value.super___atomic_base<int>._M_i =
           (pDVar4->weakref)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    lVar6 = *(long *)(this + 0x10);
    QArrayDataPointer<QPointer<QTextList>_>::detachAndGrow
              ((QArrayDataPointer<QPointer<QTextList>_> *)this,(uint)(i == 0 && lVar6 != 0),1,
               (QPointer<QTextList> **)0x0,(QArrayDataPointer<QPointer<QTextList>_> *)0x0);
    lVar3 = *(long *)(this + 8);
    if (i == 0 && lVar6 != 0) {
      *(Data **)(lVar3 + -0x10) = pDVar4;
      *(QObject **)(lVar3 + -8) = pQVar5;
      *(long *)(this + 8) = lVar3 + -0x10;
      i = *(long *)(this + 0x10);
      goto LAB_005c5210;
    }
    plVar1 = (long *)(lVar3 + i * 0x10);
    memmove(plVar1 + 2,(void *)(lVar3 + i * 0x10),(*(long *)(this + 0x10) - i) * 0x10);
    *plVar1 = (long)pDVar4;
    plVar1[1] = (long)pQVar5;
  }
  else {
    lVar6 = *(long *)(this + 0x10);
    if ((lVar6 != i) ||
       (lVar3 = *(long *)(this + 8),
       *(long *)(piVar2 + 2) ==
       ((long)(lVar3 - ((long)piVar2 + 0x1fU & 0xfffffffffffffff0)) >> 4) + i)) {
      if ((i == 0) &&
         (uVar7 = *(ulong *)(this + 8), ((long)piVar2 + 0x1fU & 0xfffffffffffffff0) != uVar7)) {
        pDVar4 = (args->wp).d;
        *(Data **)(uVar7 - 0x10) = pDVar4;
        *(QObject **)(uVar7 - 8) = (args->wp).value;
        if (pDVar4 != (Data *)0x0) {
          LOCK();
          (pDVar4->weakref)._q_value.super___atomic_base<int>._M_i =
               (pDVar4->weakref)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
          uVar7 = *(ulong *)(this + 8);
          lVar6 = *(long *)(this + 0x10);
        }
        *(ulong *)(this + 8) = uVar7 - 0x10;
        i = lVar6;
        goto LAB_005c5210;
      }
      goto LAB_005c5184;
    }
    pDVar4 = (args->wp).d;
    *(Data **)(lVar3 + i * 0x10) = pDVar4;
    *(QObject **)(lVar3 + 8 + i * 0x10) = (args->wp).value;
    if (pDVar4 == (Data *)0x0) goto LAB_005c5210;
    LOCK();
    (pDVar4->weakref)._q_value.super___atomic_base<int>._M_i =
         (pDVar4->weakref)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  i = *(long *)(this + 0x10);
LAB_005c5210:
  *(qsizetype *)(this + 0x10) = i + 1;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }